

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrator.cpp
# Opt level: O3

Spectrum * __thiscall
phyr::SamplerIntegrator::specularReflect
          (Spectrum *__return_storage_ptr__,SamplerIntegrator *this,Ray *ray,
          SurfaceInteraction *isect,Scene *scene,Sampler *sampler,MemoryPool *pool,int depth)

{
  BSDF *this_00;
  ulong uVar1;
  long lVar2;
  undefined1 auVar3 [16];
  double dVar4;
  double dVar5;
  double dVar6;
  Vector3f wi;
  double pdf;
  Vector3f wo;
  Ray rd;
  CoefficientSpectrum<60> cs_2;
  Spectrum f;
  CoefficientSpectrum<60> cs;
  CoefficientSpectrum<60> cs_1;
  double local_210 [60];
  
  wo.z = (isect->super_Interaction).wo.z;
  wo.x = (isect->super_Interaction).wo.x;
  wo.y = (isect->super_Interaction).wo.y;
  wi.z = 0.0;
  wi.x = 0.0;
  wi.y = 0.0;
  this_00 = isect->bsdf;
  (*sampler->_vptr_Sampler[5])(sampler);
  BSDF::sample_f(&f,this_00,&wo,&wi,(Point2f *)&cs_2,&pdf,BSDF_SPECULAR|BSDF_REFLECTION,
                 (BxDFType *)0x0);
  if (0.0 < pdf) {
    if ((f.super_CoefficientSpectrum<60>.samples[0] == 0.0) &&
       (!NAN(f.super_CoefficientSpectrum<60>.samples[0]))) {
      uVar1 = 0xffffffffffffffff;
      do {
        if (uVar1 == 0x3a) goto LAB_0013ea8d;
        dVar4 = f.super_CoefficientSpectrum<60>.samples[uVar1 + 2];
        uVar1 = uVar1 + 1;
      } while ((dVar4 == 0.0) && (!NAN(dVar4)));
      if (0x3a < uVar1) goto LAB_0013ea8d;
    }
    dVar4 = wi.z * (isect->shadingGeom).n.z +
            wi.x * (isect->shadingGeom).n.x + wi.y * (isect->shadingGeom).n.y;
    if ((dVar4 != 0.0) || (NAN(dVar4))) {
      Interaction::emitRay(&rd,&isect->super_Interaction,&wi);
      (*(this->super_Integrator)._vptr_Integrator[4])
                (local_210,this,&rd,scene,sampler,pool,(ulong)(depth + 1));
      lVar2 = 0;
      memset(&cs,0,0x1e0);
      do {
        dVar4 = f.super_CoefficientSpectrum<60>.samples[lVar2 + 1];
        dVar5 = local_210[lVar2 + 1];
        cs.samples[lVar2] = local_210[lVar2] * f.super_CoefficientSpectrum<60>.samples[lVar2];
        cs.samples[lVar2 + 1] = dVar5 * dVar4;
        lVar2 = lVar2 + 2;
      } while (lVar2 != 0x3c);
      dVar4 = wi.y * (isect->shadingGeom).n.y;
      dVar5 = wi.x * (isect->shadingGeom).n.x;
      dVar6 = wi.z * (isect->shadingGeom).n.z;
      lVar2 = 0;
      memset(&cs_1,0,0x1e0);
      dVar6 = dVar6 + dVar5 + dVar4;
      do {
        dVar4 = cs.samples[lVar2 + 1];
        cs_1.samples[lVar2] = cs.samples[lVar2] * ABS(dVar6);
        cs_1.samples[lVar2 + 1] = dVar4 * ABS(dVar6);
        lVar2 = lVar2 + 2;
      } while (lVar2 != 0x3c);
      lVar2 = 0;
      memset(&cs_2,0,0x1e0);
      do {
        auVar3._8_8_ = pdf;
        auVar3._0_8_ = pdf;
        auVar3 = divpd(*(undefined1 (*) [16])(cs_1.samples + lVar2),auVar3);
        *(undefined1 (*) [16])(cs_2.samples + lVar2) = auVar3;
        lVar2 = lVar2 + 2;
      } while (lVar2 != 0x3c);
      memcpy(__return_storage_ptr__,&cs_2,0x1e0);
      return __return_storage_ptr__;
    }
  }
LAB_0013ea8d:
  memset(__return_storage_ptr__,0,0x1e0);
  return __return_storage_ptr__;
}

Assistant:

Spectrum SamplerIntegrator::specularReflect(const Ray& ray,
                                            const SurfaceInteraction& isect,
                                            const Scene& scene, Sampler& sampler,
                                            MemoryPool& pool, int depth) const {
    // Compute specular reflection direction _wi_ and BSDF value
    Vector3f wo = isect.wo, wi;
    Real pdf;
    BxDFType type = BxDFType(BSDF_REFLECTION | BSDF_SPECULAR);
    Spectrum f = isect.bsdf->sample_f(wo, &wi, sampler.getNextSample2D(), &pdf, type);

    // Return contribution of specular reflection
    const Normal3f &ns = isect.shadingGeom.n;
    if (pdf > 0.f && !f.isBlack() && absDot(wi, ns) != 0.f) {
        // Compute ray differential _rd_ for specular reflection
        Ray rd = isect.emitRay(wi);

// @todo: Uncomment once RayDifferentials are implemented
#if 0
        if (ray.hasDifferentials) {
            rd.hasDifferentials = true;
            rd.rxOrigin = isect.p + isect.dpdx;
            rd.ryOrigin = isect.p + isect.dpdy;
            // Compute differential reflected directions
            Normal3f dndx = isect.shading.dndu * isect.dudx +
                            isect.shading.dndv * isect.dvdx;
            Normal3f dndy = isect.shading.dndu * isect.dudy +
                            isect.shading.dndv * isect.dvdy;
            Vector3f dwodx = -ray.rxDirection - wo,
                     dwody = -ray.ryDirection - wo;
            Float dDNdx = Dot(dwodx, ns) + Dot(wo, dndx);
            Float dDNdy = Dot(dwody, ns) + Dot(wo, dndy);
            rd.rxDirection =
                wi - dwodx + 2.f * Vector3f(Dot(wo, ns) * dndx + dDNdx * ns);
            rd.ryDirection =
                wi - dwody + 2.f * Vector3f(Dot(wo, ns) * dndy + dDNdy * ns);
        }
#endif
        return f * li(rd, scene, sampler, pool, depth + 1) * absDot(wi, ns) / pdf;
    } else { return Spectrum(0.f); }
}